

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniaudio.c
# Opt level: O2

ma_result ma_fence_release(ma_fence *pFence)

{
  ma_uint32 mVar1;
  ma_uint32 mVar2;
  ma_result mVar3;
  bool bVar4;
  
  if (pFence == (ma_fence *)0x0) {
    mVar3 = MA_INVALID_ARGS;
  }
  else {
    while( true ) {
      mVar1 = pFence->counter;
      if (mVar1 == 0) {
        __assert_fail("0",
                      "/workspace/llm4binary/github/license_c_cmakelists/stoneface86[P]trackerboy/vendored/miniaudio/miniaudio.c"
                      ,0x13d8,"ma_result ma_fence_release(ma_fence *)");
      }
      LOCK();
      mVar2 = pFence->counter;
      bVar4 = mVar1 == mVar2;
      if (bVar4) {
        pFence->counter = mVar1 - 1;
        mVar2 = mVar1;
      }
      UNLOCK();
      if (bVar4) break;
      if (mVar2 == 0) {
        __assert_fail("0",
                      "/workspace/llm4binary/github/license_c_cmakelists/stoneface86[P]trackerboy/vendored/miniaudio/miniaudio.c"
                      ,0x13e8,"ma_result ma_fence_release(ma_fence *)");
      }
    }
    mVar3 = MA_SUCCESS;
    if (mVar1 - 1 == 0) {
      ma_event_signal(&pFence->e);
    }
  }
  return mVar3;
}

Assistant:

MA_API ma_result ma_fence_release(ma_fence* pFence)
{
    if (pFence == NULL) {
        return MA_INVALID_ARGS;
    }

    for (;;) {
        ma_uint32 oldCounter = c89atomic_load_32(&pFence->counter);
        ma_uint32 newCounter = oldCounter - 1;

        if (oldCounter == 0) {
            MA_ASSERT(MA_FALSE);
            return MA_INVALID_OPERATION;    /* Acquire/release mismatch. */
        }

        if (c89atomic_compare_exchange_weak_32(&pFence->counter, &oldCounter, newCounter)) {
            #ifndef MA_NO_THREADING
            {
                if (newCounter == 0) {
                    ma_event_signal(&pFence->e);    /* <-- ma_fence_wait() will be waiting on this. */
                }
            }
            #endif

            return MA_SUCCESS;
        } else {
            if (oldCounter == 0) {
                MA_ASSERT(MA_FALSE);
                return MA_INVALID_OPERATION;    /* Another thread has taken the 0 slot. Acquire/release mismatch. */
            }
        }
    }

    /* Should never get here. */
    /*return MA_SUCCESS;*/
}